

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

void __thiscall measProblems_measFiles_Test::TestBody(measProblems_measFiles_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  uint64_t uVar3;
  precise_measurement *measure;
  uint64_t in_RCX;
  char *pcVar4;
  char *in_R9;
  unit *this_00;
  measurement mVar5;
  unit uc2;
  unit uc1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  AssertHelper local_f0;
  unit local_e8;
  measurement mc2;
  measurement mc1;
  precise_measurement m2;
  precise_measurement m1;
  string str;
  string local_70;
  string local_50;
  string cdata;
  
  std::__cxx11::string::string((string *)&str,"meas_fail",(allocator *)&gtest_ar);
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  loadFailureFile(&cdata,&str,*pPVar2);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string((string *)&local_50,(string *)&cdata);
  uVar3 = units::getDefaultFlags();
  units::measurement_from_string(&m1,&local_50,uVar3);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = units::isnormal(&m1);
  if (!bVar1) goto LAB_0013324a;
  measure = (precise_measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&str,(units *)&m1,measure,in_RCX);
  std::__cxx11::string::string((string *)&local_70,(string *)&str);
  uVar3 = units::getDefaultFlags();
  units::measurement_from_string(&m2,&local_70,uVar3);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = &mc2.units_;
  if ((((uint)m1.units_.base_units_ ^ (uint)m2.units_.base_units_) & 0xfffffff) == 0) {
    mc2.value_ = (double)CONCAT71(mc2.value_._1_7_,1);
LAB_00132a69:
    mc2.units_.multiplier_ = 0.0;
    mc2.units_.base_units_ = (unit_data)0x0;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    mc2.units_.base_units_ = m2.units_.base_units_;
    mc2.units_.multiplier_ = (float)m2.units_.multiplier_;
    mc2.value_ = m2.value_;
    mc1.units_.base_units_ = m1.units_.base_units_;
    mc1.units_.multiplier_ = (float)m1.units_.multiplier_;
    mc1.value_ = m1.value_;
    bVar1 = units::precise_measurement::operator==(&m2,&m1);
    if (bVar1) {
      testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
                ((internal *)&gtest_ar,"m2","m1",&m2,&m1);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&uc1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                   ,0x157,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&uc1,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&uc1);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      bVar1 = units::precise_measurement::operator!=(&m2,&m1);
      this_00 = (unit *)&gtest_ar__1.message_;
      gtest_ar__1.success_ = !bVar1;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (bVar1) {
        testing::Message::Message((Message *)&uc1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__1,(AssertionResult *)"m2 != m1","true"
                   ,"false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&uc2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                   ,0x158,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&uc2,(Message *)&uc1);
LAB_00133213:
        this_00 = (unit *)&gtest_ar__1.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&uc2);
        std::__cxx11::string::~string((string *)&gtest_ar);
        local_e8 = uc1;
        goto LAB_0013322a;
      }
    }
    else {
      units::root((precise_measurement *)&gtest_ar,&m2,2);
      bVar1 = units::isnormal((precise_measurement *)&gtest_ar);
      if (bVar1) {
        mVar5 = units::root(&mc2,2);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )mVar5.units_;
        gtest_ar__1._0_8_ = mVar5.value_;
        mVar5 = units::root(&mc1,2);
        uc1 = (unit)mVar5.value_;
        testing::internal::CmpHelperEQ<units::measurement,units::measurement>
                  ((internal *)&gtest_ar,"root(mc2, 2)","root(mc1, 2)",(measurement *)&gtest_ar__1,
                   (measurement *)&uc1);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&uc1,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                     ,0x15a,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&uc1,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&uc1);
          if (gtest_ar__1._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        mVar5 = units::root(&mc2,2);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )mVar5.units_;
        gtest_ar._0_8_ = mVar5.value_;
        mVar5 = units::root(&mc1,2);
        uc1 = (unit)mVar5.value_;
        bVar1 = units::measurement::operator!=((measurement *)&gtest_ar,(measurement *)&uc1);
        this_00 = (unit *)&gtest_ar__1.message_;
        gtest_ar__1.success_ = !bVar1;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (bVar1) {
          testing::Message::Message((Message *)&uc1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                     (AssertionResult *)"root(mc2, 2) != root(mc1, 2)","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&uc2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                     ,0x15b,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&uc2,(Message *)&uc1);
          goto LAB_00133213;
        }
      }
      else {
        units::root((precise_measurement *)&gtest_ar,&m2,3);
        bVar1 = units::isnormal((precise_measurement *)&gtest_ar);
        if (bVar1) {
          mVar5 = units::root(&mc2,3);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )mVar5.units_;
          gtest_ar__1._0_8_ = mVar5.value_;
          mVar5 = units::root(&mc1,3);
          uc1 = (unit)mVar5.value_;
          testing::internal::CmpHelperEQ<units::measurement,units::measurement>
                    ((internal *)&gtest_ar,"root(mc2, 3)","root(mc1, 3)",(measurement *)&gtest_ar__1
                     ,(measurement *)&uc1);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__1);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&uc1,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                       ,0x15d,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)&uc1,(Message *)&gtest_ar__1)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&uc1);
            if (gtest_ar__1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          mVar5 = units::root(&mc2,3);
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )mVar5.units_;
          gtest_ar._0_8_ = mVar5.value_;
          mVar5 = units::root(&mc1,3);
          uc1 = (unit)mVar5.value_;
          bVar1 = units::measurement::operator!=((measurement *)&gtest_ar,(measurement *)&uc1);
          this_00 = (unit *)&gtest_ar__1.message_;
          gtest_ar__1.success_ = !bVar1;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (bVar1) {
            testing::Message::Message((Message *)&uc1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                       (AssertionResult *)"root(mc2, 3) != root(mc1, 3)","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&uc2,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                       ,0x15e,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&uc2,(Message *)&uc1);
            goto LAB_00133213;
          }
        }
        else {
          bVar1 = units::isnormal(&mc1);
          if (bVar1) {
            bVar1 = units::isnormal(&mc2);
            if (bVar1) {
              bVar1 = units::measurement::operator==(&mc2,&mc1);
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__1.success_ = bVar1;
              if (!bVar1) {
                testing::Message::Message((Message *)&uc1);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                           (AssertionResult *)"mc2 == mc1","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&uc2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                           ,0x160,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=((AssertHelper *)&uc2,(Message *)&uc1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&uc2);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if (uc1 != (unit)0x0) {
                  (**(code **)(*(long *)uc1 + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__1.message_);
              bVar1 = units::measurement::operator!=(&mc2,&mc1);
              this_00 = (unit *)&gtest_ar__1.message_;
              gtest_ar__1.success_ = !bVar1;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (bVar1) {
                testing::Message::Message((Message *)&uc1);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                           (AssertionResult *)"mc2 != mc1","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&uc2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                           ,0x161,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=((AssertHelper *)&uc2,(Message *)&uc1);
                goto LAB_00133213;
              }
              goto LAB_00133235;
            }
          }
          uc1.base_units_ = m1.units_.base_units_;
          uc1.multiplier_ = (float)(m1.value_ * m1.units_.multiplier_);
          uc2.base_units_ = m2.units_.base_units_;
          uc2.multiplier_ = (float)(m2.value_ * m2.units_.multiplier_);
          bVar1 = units::unit::operator==(&uc2,&uc1);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__1.success_ = bVar1;
          if (!bVar1) {
            testing::Message::Message((Message *)&local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__1,(AssertionResult *)"uc2 == uc1",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                       ,0x165,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
            testing::internal::AssertHelper::~AssertHelper(&local_f0);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if (local_e8 != (unit)0x0) {
              (**(code **)(*(long *)local_e8 + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__1.message_);
          bVar1 = units::unit::operator!=(&uc2,&uc1);
          this_00 = (unit *)&gtest_ar__1.message_;
          gtest_ar__1.success_ = !bVar1;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (bVar1) {
            testing::Message::Message((Message *)&local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__1,(AssertionResult *)"uc2 != uc1",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                       ,0x166,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
            testing::internal::AssertHelper::~AssertHelper(&local_f0);
            std::__cxx11::string::~string((string *)&gtest_ar);
            goto LAB_0013322a;
          }
        }
      }
    }
  }
  else {
    bVar1 = units::isnormal(&m2);
    mc2.value_ = (double)CONCAT71(mc2.value_._1_7_,bVar1);
    mc2.units_.multiplier_ = 0.0;
    mc2.units_.base_units_ = (unit_data)0x0;
    if (bVar1) goto LAB_00132a69;
    testing::Message::Message((Message *)&mc1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&mc2,
               (AssertionResult *)"m2.units().has_same_base(m1.units()) || isnormal(m2)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x153,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&mc1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&gtest_ar);
    local_e8 = (unit)mc1.value_;
LAB_0013322a:
    if (local_e8 != (unit)0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
LAB_00133235:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  std::__cxx11::string::~string((string *)&str);
LAB_0013324a:
  std::__cxx11::string::~string((string *)&cdata);
  return;
}

Assistant:

TEST_P(measProblems, measFiles)
{
    auto cdata = loadFailureFile("meas_fail", GetParam());
    auto m1 = measurement_from_string(cdata);
    if (isnormal(m1)) {
        auto str = to_string(m1);
        auto m2 = measurement_from_string(str);
        ASSERT_TRUE(m2.units().has_same_base(m1.units()) || isnormal(m2));
        auto mc2 = measurement_cast(m2);
        auto mc1 = measurement_cast(m1);
        if (m2 == m1) {
            EXPECT_EQ(m2, m1);
            EXPECT_FALSE(m2 != m1);
        } else if (isnormal(root(m2, 2))) {
            EXPECT_EQ(root(mc2, 2), root(mc1, 2));
            EXPECT_FALSE(root(mc2, 2) != root(mc1, 2));
        } else if (isnormal(root(m2, 3))) {
            EXPECT_EQ(root(mc2, 3), root(mc1, 3));
            EXPECT_FALSE(root(mc2, 3) != root(mc1, 3));
        } else if (isnormal(mc1) && isnormal(mc2)) {
            EXPECT_TRUE(mc2 == mc1);
            EXPECT_FALSE(mc2 != mc1);
        } else {
            auto uc1 = unit_cast(m1.as_unit());
            auto uc2 = unit_cast(m2.as_unit());
            EXPECT_TRUE(uc2 == uc1);
            EXPECT_FALSE(uc2 != uc1);
        }
    }
}